

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int osx9orBetter(void)

{
  int iVar1;
  char *pcVar2;
  int v;
  int V;
  FILE *lIn;
  char lBuff [1024];
  int local_418;
  uint local_414;
  FILE *local_410;
  char local_408 [1032];
  
  if (osx9orBetter::lOsx9orBetter < 0) {
    osx9orBetter::lOsx9orBetter = 0;
    local_410 = popen("osascript -e \'set osver to system version of (system info)\'","r");
    local_414 = 0;
    pcVar2 = fgets(local_408,0x400,local_410);
    if (((pcVar2 != (char *)0x0) &&
        (iVar1 = __isoc99_sscanf(local_408,"%d.%d",&local_414,&local_418), iVar1 == 2)) &&
       (local_414 = local_414 * 100 + local_418, 0x3f0 < (int)local_414)) {
      osx9orBetter::lOsx9orBetter = 1;
    }
    pclose(local_410);
    if (tinyfd_verbose != 0) {
      printf("Osx10 = %d, %d = %s\n",(ulong)(uint)osx9orBetter::lOsx9orBetter,(ulong)local_414,
             local_408);
    }
  }
  return osx9orBetter::lOsx9orBetter;
}

Assistant:

static int osx9orBetter(void)
{
        static int lOsx9orBetter = -1 ;
        char lBuff[MAX_PATH_OR_CMD] ;
        FILE * lIn ;
        int V,v;

        if ( lOsx9orBetter < 0 )
        {
                lOsx9orBetter = 0 ;
                lIn = popen( "osascript -e 'set osver to system version of (system info)'" , "r" ) ;
                V = 0 ;
                if ( ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
                        && ( 2 == sscanf(lBuff, "%d.%d", &V, &v) ) )
                {
                        V = V * 100 + v;
                        if ( V >= 1009 )
                        {
                                lOsx9orBetter = 1 ;
                        }
                }
                pclose( lIn ) ;
                if (tinyfd_verbose) printf("Osx10 = %d, %d = %s\n", lOsx9orBetter, V, lBuff) ;
        }
        return lOsx9orBetter ;
}